

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_u_row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,true>>>
               (void)

{
  pointer psVar1;
  pool<boost::default_user_allocator_malloc_free> *ppVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer witness;
  long lVar7;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  column_content<typename_Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>::Column>
  orderedRows;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>
  m;
  allocator_type local_299;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_298;
  undefined8 local_264;
  undefined4 local_25c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_258;
  witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
  *local_240;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_238;
  pool<boost::default_user_allocator_malloc_free> *local_220;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
  local_218;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,true>>>>
            ();
  local_220 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_220->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_220->list).ptr = (char *)0x0;
  (local_220->list).sz = 0;
  local_220->requested_size = 0x20;
  local_220->next_size = 0x20;
  local_220->start_size = 0x20;
  local_220->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,true>>>
              *)&local_218,&local_238,(Column_settings *)local_220);
  local_258.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
        *)0x0;
  local_258.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
        *)0x0;
  local_258.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_264 = (ulong)local_264._4_4_ << 0x20;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_264;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298,__l,&local_299);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_258,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298);
  if ((pointer)local_298._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._M_impl._0_8_,
                    (long)local_298._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_298._M_impl._0_8_);
  }
  local_264 = CONCAT44(local_264._4_4_,1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_264;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298,__l_00,&local_299);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_258,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298);
  if ((pointer)local_298._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._M_impl._0_8_,
                    (long)local_298._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_298._M_impl._0_8_);
  }
  local_264 = CONCAT44(local_264._4_4_,2);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_264;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298,__l_01,&local_299);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_258,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298);
  if ((pointer)local_298._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._M_impl._0_8_,
                    (long)local_298._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_298._M_impl._0_8_);
  }
  local_264 = CONCAT44(local_264._4_4_,3);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_264;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298,__l_02,&local_299);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_258,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298);
  if ((pointer)local_298._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._M_impl._0_8_,
                    (long)local_298._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_298._M_impl._0_8_);
  }
  local_264 = CONCAT44(local_264._4_4_,4);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&local_264;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298,__l_03,&local_299);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_258,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298);
  if ((pointer)local_298._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._M_impl._0_8_,
                    (long)local_298._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_298._M_impl._0_8_);
  }
  local_264 = 0x400000003;
  local_25c = 5;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_264;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298,__l_04,&local_299);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_258,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298);
  if ((pointer)local_298._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._M_impl._0_8_,
                    (long)local_298._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_298._M_impl._0_8_);
  }
  local_264 = CONCAT44(local_264._4_4_,6);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&local_264;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298,__l_05,&local_299);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&local_258,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_298);
  if ((pointer)local_298._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._M_impl._0_8_,
                    (long)local_298._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_298._M_impl._0_8_);
  }
  local_298._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_298 + 8);
  local_298._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar5 = 0;
  local_298._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_298._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240 = local_258.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_298._M_impl.super__Rb_tree_header._M_header._M_right =
       local_298._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_258.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    witness = local_258.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::clear(&local_298);
      if (local_218.mirrorMatrixU_.
          super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
          .rowSwapped_ == true) {
        if (local_218.mirrorMatrixU_.nextInsertIndex_ != 0) {
          lVar7 = 0;
          uVar6 = 0;
          do {
            uVar4 = ((long)local_218.mirrorMatrixU_.matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_218.mirrorMatrixU_.matrix_.
                           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
            if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar6);
            }
            Gudhi::persistence_matrix::
            Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,true>>>
            ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,true>>>
                        *)((long)&((local_218.mirrorMatrixU_.matrix_.
                                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_Row_access_option).columnIndex_ + lVar7),
                       &local_218.mirrorMatrixU_.
                        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
                        .rowToIndex_,(Index)uVar6);
            uVar6 = uVar6 + 1;
            lVar7 = lVar7 + 0x38;
          } while (uVar6 < local_218.mirrorMatrixU_.nextInsertIndex_);
          if (local_218.mirrorMatrixU_.nextInsertIndex_ != 0) {
            uVar6 = 0;
            do {
              local_218.mirrorMatrixU_.
              super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
              .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] = (uint)uVar6;
              local_218.mirrorMatrixU_.
              super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
              .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] = (uint)uVar6;
              uVar6 = uVar6 + 1;
            } while (uVar6 < local_218.mirrorMatrixU_.nextInsertIndex_);
          }
        }
        local_218.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
        .rowSwapped_ = false;
      }
      psVar1 = ((local_218.mirrorMatrixU_.super_Matrix_row_access_option.rows_)->
               super__Vector_base<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (p_Var3 = *(_Base_ptr *)((long)&psVar1[uVar5]._M_t._M_impl.super__Rb_tree_header + 0x10);
          p_Var3 != &psVar1[uVar5]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        local_264._4_4_ = (uint)((ulong)local_264 >> 0x20);
        local_264 = CONCAT44(local_264._4_4_,p_Var3[1]._M_color);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&local_298,(uint *)&local_264);
      }
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,true>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>_>
                          *)&local_298);
      uVar5 = (ulong)((int)uVar5 + 1);
      witness = witness + 1;
    } while (witness != local_240);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_298);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_258);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
  ::reset(&local_218,(Column_settings *)local_220);
  ppVar2 = local_220;
  if (local_220 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_220);
  }
  operator_delete(ppVar2,0x38);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
  ::~RU_matrix(&local_218);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_238);
  return;
}

Assistant:

void test_ru_u_row_access() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<witness_content<typename Matrix::Column> > rows;
  if constexpr (Matrix::Option_list::is_z2) {
    rows.push_back({0});
    rows.push_back({1});
    rows.push_back({2});
    rows.push_back({3});
    rows.push_back({4});
    rows.push_back({3, 4, 5});
    rows.push_back({6});
  } else {
    rows.push_back({{0, 1}});
    rows.push_back({{1, 1}});
    rows.push_back({{2, 1}});
    rows.push_back({{3, 1}, {5, 4}});
    rows.push_back({{4, 1}, {5, 4}});
    rows.push_back({{5, 1}});
    rows.push_back({{6, 1}});
  }

  column_content<typename Matrix::Column> orderedRows;
  unsigned int i = 0;
  for (auto& r : rows) {
    orderedRows.clear();
    for (const auto& entry : m.get_row(i++, false)) {
      if constexpr (Matrix::Option_list::is_z2) {
        orderedRows.insert(entry.get_column_index());
      } else {
        orderedRows.insert({entry.get_column_index(), entry.get_element()});
      }
    }
    test_column_equality<typename Matrix::Column>(r, orderedRows);
  }
}